

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void swrenderer::R_FillColumnHoriz(void)

{
  undefined4 *puVar1;
  uint uVar2;
  
  if (0 < drawerargs::dc_count) {
    uVar2 = drawerargs::dc_x & 3;
    puVar1 = (undefined4 *)(&drawerargs::dc_ctspan)[uVar2];
    *puVar1 = drawerargs::dc_yl;
    puVar1[1] = drawerargs::dc_yh;
    (&drawerargs::dc_ctspan)[uVar2] = puVar1 + 2;
    DrawerCommandQueue::QueueCommand<swrenderer::FillColumnHorizPalCommand>();
    return;
  }
  return;
}

Assistant:

void R_FillColumnHoriz()
	{
		using namespace drawerargs;

		if (dc_count <= 0)
			return;

		int x = dc_x & 3;
		unsigned int **span = &dc_ctspan[x];
		(*span)[0] = dc_yl;
		(*span)[1] = dc_yh;
		*span += 2;

		DrawerCommandQueue::QueueCommand<FillColumnHorizPalCommand>();
	}